

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O2

void __thiscall HttpConnPool::start(HttpConnPool *this)

{
  HttpConn *this_00;
  int iVar1;
  __shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  HttpConnPtr hc;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  for (iVar1 = 0; iVar1 < this->connNum_; iVar1 = iVar1 + 1) {
    this_00 = (HttpConn *)operator_new(0x188);
    HttpConn::HttpConn(this_00,this->server_,-1);
    std::__shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpConn,void>
              (local_40,this_00);
    std::__cxx11::list<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>::
    push_back(&this->freeConnPool_,(value_type *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hc);
  }
  return;
}

Assistant:

void start() {
       baseLoop_->assertInLoopThread();
       started_ = true;
       for (int i = 0; i < connNum_; ++i) {
           HttpConnPtr hc(new HttpConn(server_, -1));
           freeConnPool_.push_back(std::move(hc));
       }
    }